

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O0

void Acec_MatchCheckShift
               (Gia_Man_t *pGia0,Gia_Man_t *pGia1,Vec_Wec_t *vLits0,Vec_Wec_t *vLits1,
               Vec_Int_t *vMap0,Vec_Int_t *vMap1,Vec_Wec_t *vRoots0,Vec_Wec_t *vRoots1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Wec_t *vLits1_00;
  Vec_Wec_t *vLits2;
  int nCommonMinus;
  int nCommonPlus;
  int nCommon;
  Vec_Wec_t *vRes1;
  Vec_Wec_t *vRes0;
  Vec_Int_t *vMap1_local;
  Vec_Int_t *vMap0_local;
  Vec_Wec_t *vLits1_local;
  Vec_Wec_t *vLits0_local;
  Gia_Man_t *pGia1_local;
  Gia_Man_t *pGia0_local;
  
  vLits1_00 = Acec_MatchCopy(vLits0,vMap0);
  vLits2 = Acec_MatchCopy(vLits1,vMap1);
  iVar1 = Acec_MatchCountCommon(vLits1_00,vLits2,0);
  iVar2 = Acec_MatchCountCommon(vLits1_00,vLits2,1);
  iVar3 = Acec_MatchCountCommon(vLits1_00,vLits2,-1);
  if ((iVar2 < iVar3) || (iVar2 <= iVar1)) {
    if ((iVar2 < iVar3) && (iVar1 < iVar3)) {
      Vec_WecInsertLevel(vLits1,0);
      Vec_WecInsertLevel(vRoots1,0);
      Vec_WecInsertLevel(vLits2,0);
      printf("Shifted one level down.\n");
    }
  }
  else {
    Vec_WecInsertLevel(vLits0,0);
    Vec_WecInsertLevel(vRoots0,0);
    Vec_WecInsertLevel(vLits1_00,0);
    printf("Shifted one level up.\n");
  }
  Acec_MoveDuplicates(vLits0,vLits1_00);
  Acec_MoveDuplicates(vLits1,vLits2);
  Vec_WecFree(vLits1_00);
  Vec_WecFree(vLits2);
  return;
}

Assistant:

void Acec_MatchCheckShift( Gia_Man_t * pGia0, Gia_Man_t * pGia1, Vec_Wec_t * vLits0, Vec_Wec_t * vLits1, Vec_Int_t * vMap0, Vec_Int_t * vMap1, Vec_Wec_t * vRoots0, Vec_Wec_t * vRoots1 )
{
    Vec_Wec_t * vRes0 = Acec_MatchCopy( vLits0, vMap0 );
    Vec_Wec_t * vRes1 = Acec_MatchCopy( vLits1, vMap1 );
    int nCommon      = Acec_MatchCountCommon( vRes0, vRes1,  0 );
    int nCommonPlus  = Acec_MatchCountCommon( vRes0, vRes1,  1 );
    int nCommonMinus = Acec_MatchCountCommon( vRes0, vRes1, -1 );
    if ( nCommonPlus >= nCommonMinus && nCommonPlus > nCommon )
    {
        Vec_WecInsertLevel( vLits0, 0 );
        Vec_WecInsertLevel( vRoots0, 0 );
        Vec_WecInsertLevel( vRes0, 0 );
        printf( "Shifted one level up.\n" );
    }
    else if ( nCommonMinus > nCommonPlus && nCommonMinus > nCommon )
    {
        Vec_WecInsertLevel( vLits1, 0 );
        Vec_WecInsertLevel( vRoots1, 0 );
        Vec_WecInsertLevel( vRes1, 0 );
        printf( "Shifted one level down.\n" );
    }
    Acec_MoveDuplicates( vLits0, vRes0 );
    Acec_MoveDuplicates( vLits1, vRes1 );

    //Vec_WecPrintLits( vLits1 );
    //printf( "Input literals:\n" );
    //Vec_WecPrintLits( vLits0 );
    //printf( "Equiv classes:\n" );
    //Vec_WecPrintLits( vRes0 );
    //printf( "Input literals:\n" );
    //Vec_WecPrintLits( vLits1 );
    //printf( "Equiv classes:\n" );
    //Vec_WecPrintLits( vRes1 );
    //Acec_VerifyClasses( pGia0, vLits0, vRes0 );
    //Acec_VerifyClasses( pGia1, vLits1, vRes1 );
    Vec_WecFree( vRes0 );
    Vec_WecFree( vRes1 );
}